

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnSimdStoreLaneExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset,
          uint64_t value)

{
  Result RVar1;
  Opcode opcode_local;
  Expr *local_c0;
  Address offset_local;
  undefined1 local_ac [4];
  _Head_base<0UL,_wabt::Expr_*,_false> local_a8;
  uint64_t value_local;
  Location local_98;
  Var local_78;
  
  opcode_local = opcode;
  offset_local = offset;
  value_local = value;
  GetLocation(&local_98,this);
  Var::Var(&local_78,memidx,&local_98);
  local_ac = (undefined1  [4])(1 << ((byte)alignment_log2 & 0x1f));
  std::
  make_unique<wabt::SimdStoreLaneExpr,wabt::Opcode&,wabt::Var,int,unsigned_long&,unsigned_long&>
            ((Opcode *)&local_c0,(Var *)&opcode_local,(int *)&local_78,(unsigned_long *)local_ac,
             &offset_local);
  local_a8._M_head_impl = local_c0;
  local_c0 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a8);
  if (local_a8._M_head_impl != (Expr *)0x0) {
    (*(local_a8._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_c0 != (Expr *)0x0) {
    (**(code **)(*(long *)local_c0 + 8))();
  }
  local_c0 = (Expr *)0x0;
  Var::~Var(&local_78);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSimdStoreLaneExpr(Opcode opcode,
                                           Index memidx,
                                           Address alignment_log2,
                                           Address offset,
                                           uint64_t value) {
  return AppendExpr(std::make_unique<SimdStoreLaneExpr>(
      opcode, Var(memidx, GetLocation()), 1 << alignment_log2, offset, value));
}